

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O1

void mathCore::universal_bound(expression *a)

{
  expSet *this;
  expression *peVar1;
  bool bVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  expression **__position;
  const_iterator __position_00;
  
  this = &a->contents;
  iVar4 = std::
          _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
          ::lower_bound(&this->_M_t,&global_literal);
  __position = &global_literal;
  iVar5 = std::
          _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
          ::upper_bound(&this->_M_t,&global_literal);
  bVar2 = is_and(a);
  if (bVar2) {
    while (__position_00._M_node = iVar4._M_node, __position_00._M_node != iVar5._M_node) {
      bVar3 = is_negated(*(expression **)(__position_00._M_node + 1));
      if (bVar3) goto LAB_0010865f;
      peVar1 = *(expression **)(__position_00._M_node + 1);
      if (peVar1 != (expression *)0x0) {
        expression::~expression(peVar1);
        operator_delete(peVar1);
      }
      iVar4 = std::
              _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                  *)this,__position_00);
      __position = (expression **)__position_00._M_node;
    }
  }
  else {
    bVar3 = is_or(a);
    if (iVar4._M_node != iVar5._M_node && bVar3) {
      do {
        __position = (expression **)iVar4._M_node;
        bVar3 = is_negated(*(expression **)((long)__position + 0x20));
        if (!bVar3) goto LAB_0010865f;
        peVar1 = *(expression **)((long)__position + 0x20);
        if (peVar1 != (expression *)0x0) {
          expression::~expression(peVar1);
          operator_delete(peVar1);
        }
        iVar4 = std::
                _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                    *)this,(const_iterator)__position);
      } while (iVar4._M_node != iVar5._M_node);
    }
  }
LAB_00108677:
  empty_expression((mathCore *)a,(expression *)__position);
  return;
LAB_0010865f:
  delete_children(a);
  __position = (expression **)(ulong)!bVar2;
  trans_lit(a,!bVar2);
  goto LAB_00108677;
}

Assistant:

void mathCore::universal_bound(expression* a) {
	auto literal_pos = a->contents.lower_bound(global_literal);		// Lower bound for literals in the expression
	auto literal_bound = a->contents.upper_bound(global_literal); // Upper bound for literals in the expression

	// If the expression is an AND
	if (mathCore::is_and(a)) {
		// Iterate over all literals
		while (literal_pos != literal_bound) {
			// If a literal 0 is found, the entire expression evaluates to 0
			if (mathCore::is_negated(*literal_pos)) {
				// Delete all the the children of the expression 
				mathCore::delete_children(a);
				// Turn the expression into a false literal
				mathCore::trans_lit(a, false);
				break;
			} else {
				// If the literal found was true, it can be removed
					delete *literal_pos;	// Delete the expression
					literal_pos = a->contents.erase(literal_pos);	// Advance the iterator safely
			}
		}
		// If the expression is an or statement 
	} else if (mathCore::is_or(a)) {
		// Iterate over all literals
		while (literal_pos != literal_bound) {
			// If a literal 1 is found, the entire expression evaluates to 1
			if (!(mathCore::is_negated(*literal_pos))) {
				// Delete all the the children of the expression 
				mathCore::delete_children(a);
				// Turn the expression into a true literal
				mathCore::trans_lit(a, true);
				break;
			} else {
				// If the literal found was false, it can be removed
				delete *literal_pos;	// Delete the expression
				literal_pos = a->contents.erase(literal_pos);	// Advance the iterator safely
			}
		}
	}
	mathCore::empty_expression(a);
}